

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

void __thiscall
Darts::Details::AutoPool<Darts::Details::DawgNode>::append(AutoPool<Darts::Details::DawgNode> *this)

{
  DawgNode *this_00;
  AutoPool<Darts::Details::DawgNode> *in_RDI;
  size_t in_stack_00000038;
  AutoPool<Darts::Details::DawgNode> *in_stack_00000040;
  size_t in_stack_ffffffffffffffe8;
  
  if (in_RDI->size_ == in_RDI->capacity_) {
    resize_buf(in_stack_00000040,in_stack_00000038);
  }
  in_RDI->size_ = in_RDI->size_ + 1;
  this_00 = operator[](in_RDI,in_stack_ffffffffffffffe8);
  DawgNode::DawgNode(this_00);
  return;
}

Assistant:

void append() {
    if (size_ == capacity_)
      resize_buf(size_ + 1);
    new(&(*this)[size_++]) T;
  }